

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.h
# Opt level: O0

void __thiscall
Measure<int>::Measure
          (Measure<int> *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *time,string *name,MetricType *type,int *value,vector<Tag,_std::allocator<Tag>_> *tags)

{
  undefined4 *in_RCX;
  string *in_RDX;
  undefined8 *in_RSI;
  vector<Tag,_std::allocator<Tag>_> *in_RDI;
  undefined4 *in_R8;
  vector<Tag,_std::allocator<Tag>_> *unaff_retaddr;
  vector<Tag,_std::allocator<Tag>_> *__x;
  
  (in_RDI->super__Vector_base<Tag,_std::allocator<Tag>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)*in_RSI;
  __x = in_RDI;
  std::__cxx11::string::string
            ((string *)
             &(in_RDI->super__Vector_base<Tag,_std::allocator<Tag>_>)._M_impl.
              super__Vector_impl_data._M_finish,in_RDX);
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *in_RCX;
  *(undefined4 *)
   ((long)&in_RDI[1].super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage + 4) = *in_R8;
  *(undefined4 *)
   &in_RDI[2].super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data._M_start
       = 0x3f800000;
  std::vector<Tag,_std::allocator<Tag>_>::vector(unaff_retaddr,__x);
  spdlog::debug<char[23]>((char (*) [23])0x13947a);
  return;
}

Assistant:

Measure(const time_point<high_resolution_clock> &time, const std::string& name, const MetricType &type, const T& value, const std::vector<Tag>& tags)
        : time(time), name(name), type(type), rate(1.0f), value(value), tags(tags) {
        spdlog::debug("in measure constructor");
    }